

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O2

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddQuadOp
          (InstructionBuilder *this,uint32_t type_id,Op opcode,uint32_t operand1,uint32_t operand2,
          uint32_t operand3,uint32_t operand4)

{
  IRContext *c;
  uint32_t res_id;
  Instruction *pIVar1;
  long lVar2;
  undefined4 uVar3;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<unsigned_int> init_list_02;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_1c0;
  uint32_t local_1b8;
  uint32_t local_1b4;
  uint32_t local_1b0;
  uint32_t local_1ac;
  SmallVector<unsigned_int,_2UL> local_1a8;
  SmallVector<unsigned_int,_2UL> local_180;
  SmallVector<unsigned_int,_2UL> local_158;
  SmallVector<unsigned_int,_2UL> local_130;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined1 local_f0 [48];
  undefined4 local_c0;
  SmallVector<unsigned_int,_2UL> local_b8;
  undefined4 local_90;
  SmallVector<unsigned_int,_2UL> local_88;
  undefined4 local_60;
  SmallVector<unsigned_int,_2UL> local_58;
  
  if (type_id == 0) {
    res_id = 0;
  }
  else {
    res_id = IRContext::TakeNextId(this->context_);
    if (res_id == 0) {
      return (Instruction *)0x0;
    }
  }
  pIVar1 = (Instruction *)operator_new(0x70);
  c = this->context_;
  init_list._M_len = 1;
  init_list._M_array = &local_1ac;
  local_1ac = operand1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_130,init_list);
  uVar3 = 1;
  local_f0._0_4_ = uVar3;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_f0 + 8),&local_130);
  init_list_00._M_len = 1;
  init_list_00._M_array = &local_1b0;
  local_1b0 = operand2;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_158,init_list_00);
  local_c0 = uVar3;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_b8,&local_158);
  init_list_01._M_len = 1;
  init_list_01._M_array = &local_1b4;
  local_1b4 = operand3;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_180,init_list_01);
  local_90 = uVar3;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88,&local_180);
  local_1b8 = operand4;
  init_list_02._M_len = 1;
  init_list_02._M_array = &local_1b8;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1a8,init_list_02);
  local_60 = uVar3;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,&local_1a8);
  local_108 = 0;
  uStack_100 = 0;
  local_f8 = 0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_108,
             local_f0,&stack0xffffffffffffffd0);
  Instruction::Instruction(pIVar1,c,opcode,type_id,res_id,(OperandList *)&local_108);
  local_1c0._M_head_impl = pIVar1;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_108);
  lVar2 = 0x98;
  do {
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector
              ((SmallVector<unsigned_int,_2UL> *)(local_f0 + lVar2));
    lVar2 = lVar2 + -0x30;
  } while (lVar2 != -0x28);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1a8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_180);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_158);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_130);
  pIVar1 = AddInstruction(this,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                *)&local_1c0);
  if (local_1c0._M_head_impl != (Instruction *)0x0) {
    (*((local_1c0._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
      _vptr_IntrusiveNodeBase[1])();
  }
  return pIVar1;
}

Assistant:

Instruction* AddQuadOp(uint32_t type_id, spv::Op opcode, uint32_t operand1,
                         uint32_t operand2, uint32_t operand3,
                         uint32_t operand4) {
    uint32_t result_id = 0;
    if (type_id != 0) {
      result_id = GetContext()->TakeNextId();
      if (result_id == 0) {
        return nullptr;
      }
    }
    std::unique_ptr<Instruction> newQuadOp(new Instruction(
        GetContext(), opcode, type_id, result_id,
        {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {operand1}},
         {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {operand2}},
         {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {operand3}},
         {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {operand4}}}));
    return AddInstruction(std::move(newQuadOp));
  }